

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_CoordSys.cpp
# Opt level: O2

void __thiscall amrex::CoordSys::GetFaceArea(CoordSys *this,FArrayBox *area,Box *region,int dir)

{
  int *piVar1;
  uint uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  Box reg;
  
  reg.smallend.vect._0_8_ = *(undefined8 *)(region->smallend).vect;
  uVar3 = *(undefined8 *)((region->smallend).vect + 2);
  uVar4 = *(undefined8 *)((region->bigend).vect + 2);
  reg.bigend.vect[1] = (int)((ulong)*(undefined8 *)(region->bigend).vect >> 0x20);
  reg.bigend.vect[2] = (int)uVar4;
  reg.btype.itype = SUB84(uVar4,4);
  uVar5 = reg._20_8_;
  reg.smallend.vect[2] = (int)uVar3;
  reg.bigend.vect[0] = (int)((ulong)uVar3 >> 0x20);
  reg.btype.itype = SUB84(uVar4,4);
  uVar2 = reg.btype.itype >> (dir & 0x1fU);
  reg._20_8_ = uVar5;
  if ((uVar2 & 1) == 0) {
    piVar1 = reg.bigend.vect + dir;
    *piVar1 = *piVar1 + 1;
    reg.btype.itype = reg.btype.itype | 1 << ((byte)dir & 0x1f);
  }
  FArrayBox::resize(area,&reg,1,(Arena *)0x0);
  SetFaceArea(this,area,&reg,dir);
  return;
}

Assistant:

void
CoordSys::GetFaceArea (FArrayBox& area,
                       const Box& region,
                       int        dir) const
{
    Box reg(region);
    reg.surroundingNodes(dir);
    area.resize(reg,1);
    SetFaceArea(area,reg,dir);
}